

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  vector<char_const*,std::allocator<char_const*>> *this_00;
  char cVar1;
  uint maxY;
  CompressorScheme CVar2;
  iterator __position;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_type *psVar8;
  char *pcVar9;
  char *compressed;
  pointer pCVar10;
  pointer pCVar11;
  BaseExc *pBVar12;
  InputExc *this_01;
  long lVar13;
  ulong uVar14;
  pointer ppcVar15;
  ushort uVar16;
  char *extraout_RDX;
  uint minY;
  char *pcVar17;
  undefined1 *toNonlinear;
  uint uVar18;
  ulong uVar19;
  int byte;
  ulong uVar20;
  size_t __n;
  bool bVar21;
  ulong local_378;
  char *local_370;
  char *local_360;
  char *inDataPtr;
  vector<bool,_std::allocator<bool>_> encodedChannels;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  channelRules;
  size_t outBufferSize;
  char **local_2b8;
  char *writePtr;
  int local_290;
  int local_28c;
  
  inDataPtr = inPtr;
  local_2b8 = outPtr;
  initializeDefaultChannelRules(this);
  outBufferSize = 0;
  initializeBuffers(this,&outBufferSize);
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  relevantChannelRules(this,&channelRules);
  if ((long)channelRules.
            super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)channelRules.
            super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    uVar16 = 2;
  }
  else {
    lVar13 = ((long)channelRules.
                    super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)channelRules.
                    super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar13 = lVar13 + (ulong)(lVar13 == 0);
    psVar8 = &((channelRules.
                super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_string_length;
    uVar16 = 2;
    do {
      uVar16 = uVar16 + (short)*psVar8 + 3;
      psVar8 = psVar8 + 6;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  uVar20 = outBufferSize + uVar16;
  outBufferSize = uVar20;
  if (this->_outBufferSize < uVar20) {
    this->_outBufferSize = uVar20;
    if (this->_outBuffer != (char *)0x0) {
      operator_delete__(this->_outBuffer);
    }
    pcVar9 = (char *)operator_new__(uVar20);
    this->_outBuffer = pcVar9;
  }
  pcVar9 = this->_outBuffer;
  local_370 = this->_packedAcBuffer;
  local_360 = this->_packedDcBuffer;
  uVar18 = (range->max).x;
  if (this->_max[0] < (int)uVar18) {
    uVar18 = this->_max[0];
  }
  uVar20 = (ulong)uVar18;
  iVar7 = (range->min).x;
  minY = (range->min).y;
  maxY = (range->max).y;
  if (this->_max[1] < (int)maxY) {
    maxY = this->_max[1];
  }
  pcVar9[0] = '\0';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  pcVar9[8] = '\0';
  pcVar9[9] = '\0';
  pcVar9[10] = '\0';
  pcVar9[0xb] = '\0';
  pcVar9[0xc] = '\0';
  pcVar9[0xd] = '\0';
  pcVar9[0xe] = '\0';
  pcVar9[0xf] = '\0';
  pcVar9[0x40] = '\0';
  pcVar9[0x41] = '\0';
  pcVar9[0x42] = '\0';
  pcVar9[0x43] = '\0';
  pcVar9[0x44] = '\0';
  pcVar9[0x45] = '\0';
  pcVar9[0x46] = '\0';
  pcVar9[0x47] = '\0';
  pcVar9[0x48] = '\0';
  pcVar9[0x49] = '\0';
  pcVar9[0x4a] = '\0';
  pcVar9[0x4b] = '\0';
  pcVar9[0x4c] = '\0';
  pcVar9[0x4d] = '\0';
  pcVar9[0x4e] = '\0';
  pcVar9[0x4f] = '\0';
  pcVar9[0x30] = '\0';
  pcVar9[0x31] = '\0';
  pcVar9[0x32] = '\0';
  pcVar9[0x33] = '\0';
  pcVar9[0x34] = '\0';
  pcVar9[0x35] = '\0';
  pcVar9[0x36] = '\0';
  pcVar9[0x37] = '\0';
  pcVar9[0x38] = '\0';
  pcVar9[0x39] = '\0';
  pcVar9[0x3a] = '\0';
  pcVar9[0x3b] = '\0';
  pcVar9[0x3c] = '\0';
  pcVar9[0x3d] = '\0';
  pcVar9[0x3e] = '\0';
  pcVar9[0x3f] = '\0';
  pcVar9[0x20] = '\0';
  pcVar9[0x21] = '\0';
  pcVar9[0x22] = '\0';
  pcVar9[0x23] = '\0';
  pcVar9[0x24] = '\0';
  pcVar9[0x25] = '\0';
  pcVar9[0x26] = '\0';
  pcVar9[0x27] = '\0';
  pcVar9[0x28] = '\0';
  pcVar9[0x29] = '\0';
  pcVar9[0x2a] = '\0';
  pcVar9[0x2b] = '\0';
  pcVar9[0x2c] = '\0';
  pcVar9[0x2d] = '\0';
  pcVar9[0x2e] = '\0';
  pcVar9[0x2f] = '\0';
  pcVar9[0x10] = '\0';
  pcVar9[0x11] = '\0';
  pcVar9[0x12] = '\0';
  pcVar9[0x13] = '\0';
  pcVar9[0x14] = '\0';
  pcVar9[0x15] = '\0';
  pcVar9[0x16] = '\0';
  pcVar9[0x17] = '\0';
  pcVar9[0x18] = '\0';
  pcVar9[0x19] = '\0';
  pcVar9[0x1a] = '\0';
  pcVar9[0x1b] = '\0';
  pcVar9[0x1c] = '\0';
  pcVar9[0x1d] = '\0';
  pcVar9[0x1e] = '\0';
  pcVar9[0x1f] = '\0';
  pcVar9[0x50] = '\0';
  pcVar9[0x51] = '\0';
  pcVar9[0x52] = '\0';
  pcVar9[0x53] = '\0';
  pcVar9[0x54] = '\0';
  pcVar9[0x55] = '\0';
  pcVar9[0x56] = '\0';
  pcVar9[0x57] = '\0';
  pcVar9[0] = '\x02';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  *(ulong *)(pcVar9 + 0x50) = (ulong)this->_acCompression;
  setupChannelData(this,iVar7,minY,uVar18,maxY);
  compressed = pcVar9 + (ulong)uVar16 + 0x58;
  writePtr = this->_outBuffer + 0x58;
  encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT62(encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._2_6_,uVar16);
  lVar13 = 0;
  do {
    pcVar17 = writePtr;
    cVar1 = *(char *)((long)&encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar13);
    uVar20 = CONCAT71((int7)(uVar20 >> 8),cVar1);
    writePtr = writePtr + 1;
    *pcVar17 = cVar1;
    lVar13 = lVar13 + 1;
  } while ((int)lVar13 != 2);
  if (channelRules.
      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      channelRules.
      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 0;
    uVar19 = 0;
    do {
      Classifier::write((Classifier *)
                        ((long)&((channelRules.
                                  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_dataplus.
                                _M_p + lVar13),(int)&writePtr,pcVar17,uVar20);
      uVar19 = uVar19 + 1;
      uVar20 = 0xaaaaaaaaaaaaaaab;
      lVar13 = lVar13 + 0x30;
      pcVar17 = extraout_RDX;
    } while (uVar19 < (ulong)(((long)channelRules.
                                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)channelRules.
                                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x5555555555555555));
  }
  writePtr = (char *)((ulong)writePtr & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&encodedChannels,
             ((long)(this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
             (bool *)&writePtr,(allocator_type *)&rowPtrs);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector(&rowPtrs,((long)(this->_channelData).
                           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_channelData).
                           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
           (allocator_type *)&writePtr);
  lVar13 = (long)(this->_channelData).
                 super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_channelData).
                 super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    uVar20 = (lVar13 >> 3) * -0x79435e50d79435e5;
    uVar19 = 0;
    do {
      bVar4 = (byte)uVar19 & 0x3f;
      encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] =
           encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] &
           (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      uVar19 = uVar19 + 1;
    } while ((uVar19 & 0xffffffff) <= uVar20 && uVar20 - (uVar19 & 0xffffffff) != 0);
  }
  inDataPtr = inPtr;
  if ((int)minY <= (int)maxY) {
    do {
      pCVar11 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_channelData).
          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar11) {
        uVar20 = 0;
        uVar19 = 1;
        do {
          uVar18 = pCVar11[uVar20].ySampling;
          if ((int)minY < 0) {
            if (-1 < (int)uVar18) {
              uVar5 = (uVar18 + ~minY) / uVar18;
              goto LAB_0040cd16;
            }
            uVar5 = (~uVar18 - minY) / -uVar18;
          }
          else if ((int)uVar18 < 0) {
            uVar5 = minY / -uVar18;
LAB_0040cd16:
            uVar5 = -uVar5;
          }
          else {
            uVar5 = minY / uVar18;
          }
          if (minY == uVar5 * uVar18) {
            this_00 = (vector<char_const*,std::allocator<char_const*>> *)
                      (rowPtrs.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar20);
            __position._M_current = *(char ***)(this_00 + 8);
            if (__position._M_current == *(char ***)(this_00 + 0x10)) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>(this_00,__position,&inDataPtr);
            }
            else {
              *__position._M_current = inDataPtr;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
            iVar7 = pCVar11[uVar20].width;
            iVar6 = pixelTypeSize(pCVar11[uVar20].type);
            inDataPtr = inDataPtr + (long)iVar6 * (long)iVar7;
          }
          pCVar11 = (this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar20 = ((long)(this->_channelData).
                          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11 >> 3) *
                   -0x79435e50d79435e5;
          bVar21 = uVar19 <= uVar20;
          lVar13 = uVar20 - uVar19;
          uVar20 = uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (bVar21 && lVar13 != 0);
      }
      bVar21 = minY != maxY;
      minY = minY + 1;
    } while (bVar21);
  }
  pCVar10 = (this->_cscSets).
            super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  inDataPtr = inPtr;
  if ((this->_cscSets).
      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar10) {
    uVar18 = 1;
    uVar20 = 0;
    do {
      iVar7 = pCVar10[uVar20].idx[0];
      pCVar11 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      LossyDctEncoderCsc::LossyDctEncoderCsc
                ((LossyDctEncoderCsc *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar7,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar10[uVar20].idx[1],
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar10[uVar20].idx[2],local_370,
                 local_360,(unsigned_short *)dwaCompressorToNonlinear,pCVar11[iVar7].width,
                 pCVar11[iVar7].height,pCVar11[iVar7].type,pCVar11[pCVar10[uVar20].idx[1]].type,
                 pCVar11[pCVar10[uVar20].idx[2]].type);
      LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
      *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + (long)local_290;
      *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + (long)local_28c;
      pCVar10 = (this->_cscSets).
                super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (ulong)pCVar10[uVar20].idx[0];
      uVar19 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar19 = uVar14;
      }
      encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)pCVar10[uVar20].idx[0] & 0x3f);
      local_370 = local_370 + (long)local_290 * 2;
      local_360 = local_360 + (long)local_28c * 2;
      uVar14 = (ulong)pCVar10[uVar20].idx[1];
      uVar19 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar19 = uVar14;
      }
      encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)pCVar10[uVar20].idx[1] & 0x3f);
      uVar14 = (ulong)pCVar10[uVar20].idx[2];
      uVar19 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar19 = uVar14;
      }
      encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar19 >> 6) + ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)pCVar10[uVar20].idx[2] & 0x3f);
      LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
      uVar20 = (ulong)uVar18;
      pCVar10 = (this->_cscSets).
                super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->_cscSets).
                      super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar10 >> 2) *
               -0x5555555555555555;
      uVar18 = uVar18 + 1;
    } while (uVar20 <= uVar19 && uVar19 - uVar20 != 0);
  }
  pCVar11 = (this->_channelData).
            super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar11) {
    uVar20 = 0;
    do {
      if ((encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] >>
           (uVar20 & 0x3f) & 1) == 0) {
        CVar2 = pCVar11[uVar20].compression;
        if (CVar2 == UNKNOWN) {
          iVar7 = pCVar11[uVar20].width;
          iVar6 = pixelTypeSize(pCVar11[uVar20].type);
          ppcVar15 = rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20].
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (rowPtrs.
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar20].
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppcVar15) {
            __n = (long)iVar6 * (long)iVar7;
            uVar19 = 0;
            uVar14 = 1;
            do {
              memcpy(pCVar11[uVar20].planarUncBufferEnd,ppcVar15[uVar19],__n);
              pCVar11[uVar20].planarUncBufferEnd = pCVar11[uVar20].planarUncBufferEnd + __n;
              ppcVar15 = rowPtrs.
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar20].
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              bVar21 = uVar14 < (ulong)((long)rowPtrs.
                                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar20].
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppcVar15 >> 3);
              uVar19 = uVar14;
              uVar14 = (ulong)((int)uVar14 + 1);
            } while (bVar21);
          }
          *(long *)(pcVar9 + 8) = *(long *)(pcVar9 + 8) + (long)pCVar11[uVar20].planarUncSize;
        }
        else if (CVar2 == LOSSY_DCT) {
          toNonlinear = dwaCompressorToNonlinear;
          if (pCVar11[uVar20].pLinear != false) {
            toNonlinear = (undefined1 *)0x0;
          }
          LossyDctEncoder::LossyDctEncoder
                    ((LossyDctEncoder *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                     rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar20,local_370,local_360,
                     (unsigned_short *)toNonlinear,pCVar11[uVar20].width,pCVar11[uVar20].height,
                     pCVar11[uVar20].type);
          LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
          *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + (long)local_290;
          *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + (long)local_28c;
          local_370 = local_370 + (long)local_290 * 2;
          local_360 = local_360 + (long)local_28c * 2;
          LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
        }
        else if ((CVar2 == RLE) &&
                (ppcVar15 = rowPtrs.
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar20].
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                rowPtrs.
                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20].
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish != ppcVar15)) {
          local_378 = 0;
          do {
            iVar7 = pCVar11[uVar20].width;
            if (0 < iVar7) {
              pcVar17 = ppcVar15[local_378];
              iVar6 = 0;
              do {
                for (lVar13 = 0; iVar7 = pixelTypeSize(pCVar11[uVar20].type), lVar13 < iVar7;
                    lVar13 = lVar13 + 1) {
                  cVar1 = pcVar17[lVar13];
                  pcVar3 = pCVar11[uVar20].planarUncRleEnd[lVar13];
                  pCVar11[uVar20].planarUncRleEnd[lVar13] = pcVar3 + 1;
                  *pcVar3 = cVar1;
                }
                iVar6 = iVar6 + 1;
                iVar7 = pCVar11[uVar20].width;
                pcVar17 = pcVar17 + lVar13;
              } while (iVar6 < iVar7);
            }
            iVar6 = pixelTypeSize(pCVar11[uVar20].type);
            *(long *)(pcVar9 + 0x38) = *(long *)(pcVar9 + 0x38) + (long)(iVar6 * iVar7);
            local_378 = (ulong)((int)local_378 + 1);
            ppcVar15 = rowPtrs.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar20].
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (local_378 <
                   (ulong)((long)rowPtrs.
                                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar20].
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar15 >> 3));
        }
        encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] =
             encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20 >> 6] |
             1L << ((byte)uVar20 & 0x3f);
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      pCVar11 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = ((long)(this->_channelData).
                      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11 >> 3) *
               -0x79435e50d79435e5;
    } while (uVar20 <= uVar19 && uVar19 - uVar20 != 0);
  }
  lVar13 = *(long *)(pcVar9 + 8);
  if (lVar13 != 0) {
    writePtr = (char *)compressBound(lVar13);
    iVar7 = compress2(compressed,&writePtr,this->_planarUncBuffer[0],lVar13,9);
    if (iVar7 != 0) {
      pBVar12 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar12,"Data compression (zlib) failed.");
      __cxa_throw(pBVar12,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    compressed = compressed + (long)writePtr;
    *(char **)(pcVar9 + 0x10) = writePtr;
  }
  lVar13 = *(long *)(pcVar9 + 0x40);
  if (lVar13 == 0) goto LAB_0040d3a6;
  if (this->_acCompression == DEFLATE) {
    writePtr = (char *)compressBound(lVar13 * 2);
    iVar7 = compress2(compressed,&writePtr,this->_packedAcBuffer,*(long *)(pcVar9 + 0x40) * 2,9);
    pcVar17 = writePtr;
    if (iVar7 != 0) {
      this_01 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this_01,"Data compression (zlib) failed.");
      __cxa_throw(this_01,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
LAB_0040d39e:
    *(char **)(pcVar9 + 0x18) = pcVar17;
  }
  else if (this->_acCompression == STATIC_HUFFMAN) {
    iVar7 = hufCompress((unsigned_short *)this->_packedAcBuffer,(int)lVar13,compressed);
    pcVar17 = (char *)(long)iVar7;
    goto LAB_0040d39e;
  }
  compressed = compressed + *(long *)(pcVar9 + 0x18);
LAB_0040d3a6:
  if (*(long *)(pcVar9 + 0x48) != 0) {
    iVar7 = Zip::compress(this->_zip,this->_packedDcBuffer,(int)*(long *)(pcVar9 + 0x48) * 2,
                          compressed);
    *(long *)(pcVar9 + 0x20) = (long)iVar7;
    compressed = compressed + iVar7;
  }
  if (*(long *)(pcVar9 + 0x38) != 0) {
    iVar7 = rleCompress((int)*(long *)(pcVar9 + 0x38),this->_planarUncBuffer[2],this->_rleBuffer);
    *(long *)(pcVar9 + 0x30) = (long)iVar7;
    writePtr = (char *)compressBound();
    iVar7 = compress2(compressed,&writePtr,this->_rleBuffer,*(undefined8 *)(pcVar9 + 0x30),9);
    if (iVar7 != 0) {
      pBVar12 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar12,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar12,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *(char **)(pcVar9 + 0x28) = writePtr;
    compressed = compressed + (long)writePtr;
  }
  lVar13 = 0;
  do {
    writePtr = this->_outBuffer + lVar13;
    Xdr::write<Imf_2_5::CharPtrIO,char*>(&writePtr,*(unsigned_long *)(this->_outBuffer + lVar13));
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x58);
  *local_2b8 = this->_outBuffer;
  pcVar9 = this->_outBuffer;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&rowPtrs);
  if (encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    encodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector(&channelRules);
  return ((int)compressed - (int)pcVar9) + 1;
}

Assistant:

int 
DwaCompressor::compress
    (const char             *inPtr,
     int                    inSize,
     IMATH_NAMESPACE::Box2i range,
     const char             *&outPtr)
{
    const char *inDataPtr   = inPtr;
    char       *packedAcEnd = 0;
    char       *packedDcEnd = 0; 
    int         fileVersion = 2;   // Starting with 2, we write the channel
                                   // classification rules into the file

    if (fileVersion < 2) 
        initializeLegacyChannelRules();
    else 
        initializeDefaultChannelRules();

    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2) 
    {
        relevantChannelRules(channelRules);

        channelRuleSize = Xdr::size<unsigned short>();
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRuleSize += channelRules[i].size();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize) 
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0)
            delete[] _outBuffer;       
        _outBuffer = new char[outBufferSize];
    }

    char *outDataPtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64) +
                                   channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and deferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer)
        packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer)
        packedDcEnd = _packedDcBuffer;

    #define OBIDX(x) (Int64 *)&_outBuffer[x * sizeof (Int64)]

    Int64 *version                 = OBIDX (VERSION);
    Int64 *unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 *unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    Int64 *acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    Int64 *dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    Int64 *rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    Int64 *rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    Int64 *rleRawSize              = OBIDX (RLE_RAW_SIZE);

    Int64 *totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    Int64 *totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    Int64 *acCompression            = OBIDX (AC_COMPRESSION);

    int minX   = range.min.x;
    int maxX   = std::min(range.max.x, _max[0]);
    int minY   = range.min.y;
    int maxY   = std::min(range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (Int64));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;  
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2) 
    {
        char *writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);
        
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRules[i].write(writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size());
    std::vector< std::vector<const char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        encodedChannels[chan] = false;

    inDataPtr =  inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {

            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp(y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back(inDataPtr);
            inDataPtr += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
        }
    }

    inDataPtr = inPtr;

    // 
    // Make a pass over all our CSC sets and try to encode them first
    // 

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {

        LossyDctEncoderCsc encoder
            (_dwaCompressionLevel / 100000.f,
             rowPtrs[_cscSets[csc].idx[0]],
             rowPtrs[_cscSets[csc].idx[1]],
             rowPtrs[_cscSets[csc].idx[2]],
             packedAcEnd,
             packedDcEnd,
             dwaCompressorToNonlinear,
             _channelData[_cscSets[csc].idx[0]].width,
             _channelData[_cscSets[csc].idx[0]].height,
             _channelData[_cscSets[csc].idx[0]].type,
             _channelData[_cscSets[csc].idx[1]].type,
             _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute();

        *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
        *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

        packedAcEnd += encoder.numAcValuesEncoded() * sizeof(unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded() * sizeof(unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        if (encodedChannels[chan])
            continue;

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // For LOSSY_DCT, treat this just like the CSC'd case,
            // but only operate on one channel
            //

            {
                const unsigned short *nonlinearLut = 0;

                if (!cd->pLinear)
                    nonlinearLut = dwaCompressorToNonlinear; 

                LossyDctEncoder encoder
                    (_dwaCompressionLevel / 100000.f,
                     rowPtrs[chan],
                     packedAcEnd,
                     packedDcEnd,
                     nonlinearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                encoder.execute();

                *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
                *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

                packedAcEnd +=
                    encoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcEnd +=
                    encoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For RLE, bash the bytes up so that the first bytes of each
            // pixel are contingous, as are the second bytes, and so on.
            //

            for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
            {
                const char *row = rowPtrs[chan][y];

                for (int x = 0; x < cd->width; ++x)
                {
                    for (int byte = 0;
                         byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                         ++byte)
                    {
                            
                        *cd->planarUncRleEnd[byte]++ = *row++;
                    }
                }

                *rleRawSize += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
            }

            break;

          case UNKNOWN:
           
            //
            // Otherwise, just copy data over verbatim
            //

            {
                int scanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);

                for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
                {
                    memcpy (cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);
    
                    cd->planarUncBufferEnd += scanlineSize;
                }

                *unknownUncompressedSize += cd->planarUncSize;
            }

            break;

          default:

            assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        uLongf inSize  = (uLongf)(*unknownUncompressedSize);
        uLongf outSize = compressBound (inSize);

        if (Z_OK != ::compress2 ((Bytef *)outDataPtr,
                                 &outSize,
                                 (const Bytef *)_planarUncBuffer[UNKNOWN],
                                 inSize,
                                 9))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of 
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    { 
        switch (_acCompression)
        {
          case STATIC_HUFFMAN:

            *acCompressedSize = (int)
                hufCompress((unsigned short *)_packedAcBuffer,
                            (int)*totalAcUncompressedCount,
                            outDataPtr);                
            break;

          case DEFLATE:

            {
                uLongf destLen = compressBound (
                    (*totalAcUncompressedCount) * sizeof (unsigned short));

                if (Z_OK != ::compress2
                                ((Bytef *)outDataPtr,
                                 &destLen,
                                 (Bytef *)_packedAcBuffer, 
                                 (uLong)(*totalAcUncompressedCount
                                                * sizeof (unsigned short)),
                                 9))
                {
                    throw IEX_NAMESPACE::InputExc ("Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;        
            }

            break;

          default:
            
            assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    // 
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress
            (_packedDcBuffer,
             (int)(*totalDcUncompressedCount) * sizeof (unsigned short),
             outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    // 
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //    

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress
            ((int)(*rleRawSize),
             _planarUncBuffer[RLE],
             (signed char *)_rleBuffer);

        uLongf dstLen = compressBound ((uLongf)*rleUncompressedSize);

        if (Z_OK != ::compress2
                        ((Bytef *)outDataPtr, 
                         &dstLen, 
                         (Bytef *)_rleBuffer, 
                         (uLong)(*rleUncompressedSize),
                         9))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }
        
       *rleCompressedSize = dstLen;
        outDataPtr       += *rleCompressedSize;
    }

    // 
    // Flip the counters to XDR format
    //         

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64  src = *(((Int64 *)_outBuffer) + i);
        char  *dst = (char *)(((Int64 *)_outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int>(outDataPtr - _outBuffer + 1);
}